

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGhsMultiGenerator.cxx
# Opt level: O2

void __thiscall cmLocalGhsMultiGenerator::Generate(cmLocalGhsMultiGenerator *this)

{
  cmGeneratorTarget *this_00;
  bool bVar1;
  pointer ppcVar2;
  cmGhsMultiTargetGenerator tg;
  _Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> local_120;
  cmGhsMultiTargetGenerator local_108;
  
  cmGlobalGenerator::GetLocalGeneratorTargetsInOrder
            ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)&local_120,
             (this->super_cmLocalGenerator).GlobalGenerator,&this->super_cmLocalGenerator);
  for (ppcVar2 = local_120._M_impl.super__Vector_impl_data._M_start;
      ppcVar2 != local_120._M_impl.super__Vector_impl_data._M_finish; ppcVar2 = ppcVar2 + 1) {
    this_00 = *ppcVar2;
    bVar1 = cmGeneratorTarget::IsInBuildSystem(this_00);
    if (bVar1) {
      cmGhsMultiTargetGenerator::cmGhsMultiTargetGenerator(&local_108,this_00);
      cmGhsMultiTargetGenerator::Generate(&local_108);
      cmGhsMultiTargetGenerator::~cmGhsMultiTargetGenerator(&local_108);
    }
  }
  std::_Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::~_Vector_base
            (&local_120);
  return;
}

Assistant:

void cmLocalGhsMultiGenerator::Generate()
{
  for (cmGeneratorTarget* gt :
       this->GlobalGenerator->GetLocalGeneratorTargetsInOrder(this)) {
    if (!gt->IsInBuildSystem()) {
      continue;
    }

    cmGhsMultiTargetGenerator tg(gt);
    tg.Generate();
  }
}